

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O3

int __thiscall
libtorrent::aux::bencode_visitor<char_*>::operator()(bencode_visitor<char_*> *this,list_type *l)

{
  char **ppcVar1;
  variant<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  *pvVar2;
  __visit_result_t<libtorrent::aux::bencode_visitor<char_*>_&,_const_std::variant<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>_&>
  _Var3;
  int iVar4;
  entry *i;
  variant<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  *__variants;
  
  ppcVar1 = this->out;
  **ppcVar1 = 'l';
  *ppcVar1 = *ppcVar1 + 1;
  pvVar2 = &((l->super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>)._M_impl.
             super__Vector_impl_data._M_finish)->super_variant_type;
  iVar4 = 2;
  for (__variants = &((l->super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>)
                      ._M_impl.super__Vector_impl_data._M_start)->super_variant_type;
      __variants != pvVar2; __variants = __variants + 1) {
    _Var3 = ::std::
            visit<libtorrent::aux::bencode_visitor<char*>&,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
                      (this,__variants);
    iVar4 = iVar4 + _Var3;
  }
  ppcVar1 = this->out;
  **ppcVar1 = 'e';
  *ppcVar1 = *ppcVar1 + 1;
  return iVar4;
}

Assistant:

int operator()(entry::list_type const& l)
		{
			write_char(out, 'l');
			int ret = 2;
			for (auto const& i : l)
				ret += std::visit(*this, static_cast<entry::variant_type const&>(i));
			write_char(out, 'e');
			return ret;
		}